

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::FindNextProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,ScriptContext *scriptContext,
          PropertyIndex *index,JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  PropertyId propertyId_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<unsigned_short> DVar1;
  PropertyRecord *pPVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  unsigned_short propIndex;
  undefined4 *puVar6;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar7;
  PropertyRecord **ppPVar8;
  PropertyString *this_01;
  PolymorphicInlineCache *polymorphicInlineCache;
  ulong uVar9;
  DictionaryPropertyDescriptor<unsigned_short> local_38;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x70,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00c22e5f;
    *puVar6 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x71,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00c22e5f;
    *puVar6 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72,"(type)","type");
    if (!bVar4) {
LAB_00c22e5f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  uVar5 = *index;
  do {
    this_00 = (this->propertyMap).ptr;
    if (this_00->count - this_00->freeCount <= (int)(uint)uVar5) {
      if (info != (PropertyValueInfo *)0x0) {
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
      }
      return 0;
    }
    pDVar7 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(this_00,(uint)uVar5);
    DVar1 = *pDVar7;
    uVar9 = (ulong)DVar1 >> 8;
    local_38 = DVar1;
    if ((((uVar9 & 8) == 0) &&
        (((flags & EnumNonEnumerable) != None || (((ulong)DVar1 & 0x100) != 0)))) &&
       (((uVar9 & 0x10) == 0 ||
        (((byte)((uVar9 & 0xffffffff) >> 4) & 0xf & ((ulong)DVar1 & 2) == 0) == 0)))) {
      ppPVar8 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,(uint)*index);
      pPVar2 = *ppPVar8;
      if (((flags & EnumSymbols) != None) || (pPVar2->isSymbol == false)) {
        if (attributes != (PropertyAttributes *)0x0) {
          *attributes = DVar1.Attributes;
        }
        propertyId_00 = pPVar2->pid;
        *propertyId = propertyId_00;
        this_01 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
        *propertyStringName = &this_01->super_JavascriptString;
        propIndex = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                              (&local_38);
        if ((((DynamicType *)type == typeToEnumerate) && (((ulong)DVar1 & 0x400) != 0)) &&
           (propIndex != 0xffff)) {
          polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_01);
          PropertyValueInfo::SetCacheInfo<Js::PropertyString>
                    (info,this_01,polymorphicInlineCache,false);
          SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,propIndex,&local_38);
        }
        else if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
        return 1;
      }
    }
    uVar5 = *index + 1;
    *index = uVar5;
  } while( true );
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for (; index < propertyMap->Count(); ++index)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);
            PropertyAttributes attribs = descriptor.Attributes;

            if (!(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)) &&
                (!(attribs & PropertyLetConstGlobal) || descriptor.HasNonLetConstGlobal()))
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(index);

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                // Pass back attributes of this property so caller can use them if it needs
                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propertyString;
                T dataSlot = descriptor.template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots && (attribs & PropertyWritable) && type == typeToEnumerate)
                {
                    PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                    SetPropertyValueInfo(info, instance, dataSlot, &descriptor);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }